

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O3

secp256k1_pubkey_conflict *
cfd::core::ParsePubkey(secp256k1_pubkey_conflict *__return_storage_ptr__,Pubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  string local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  Pubkey::GetData((ByteData *)&local_58,pubkey);
  ByteData::GetBytes(&local_38,(ByteData *)&local_58);
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  ctx = wally_get_secp_context();
  iVar1 = secp256k1_ec_pubkey_parse
                    (ctx,__return_storage_ptr__,
                     local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_38.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_38.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  if (iVar1 == 1) {
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Secp256k1 pubkey parse error","");
  CfdException::CfdException(this,kCfdInternalError,&local_58);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_pubkey ParsePubkey(const Pubkey& pubkey) {
  auto pubkey_bytes = pubkey.GetData().GetBytes();
  auto ctx = wally_get_secp_context();
  secp256k1_pubkey result;
  int ret = secp256k1_ec_pubkey_parse(
      ctx, &result, pubkey_bytes.data(), pubkey_bytes.size());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 pubkey parse error");
  }

  return result;
}